

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

void tinyobj::LoadMtl(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *material_map,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     istream *inStream,string *warning,string *err)

{
  size_t *psVar1;
  char cVar2;
  char cVar3;
  pointer pmVar4;
  pointer pmVar5;
  undefined1 auVar6 [8];
  int iVar7;
  long lVar8;
  size_t sVar9;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ostream *poVar10;
  char *pcVar11;
  undefined7 extraout_var;
  undefined8 extraout_RAX_01;
  undefined8 uVar12;
  texture_option_t *texopt;
  string *texname;
  real_t rVar13;
  stringstream local_b28 [8];
  stringstream warn_ss;
  ostream local_b18 [376];
  undefined1 local_9a0 [8];
  material_t material;
  stringstream sstr;
  ostream local_248 [16];
  undefined4 local_238;
  undefined1 local_d0 [8];
  string linebuf;
  undefined1 local_a0 [8];
  real_t b;
  undefined4 local_7c;
  undefined1 local_78 [8];
  real_t g;
  char local_68 [16];
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_58;
  pointer local_50;
  uint local_48;
  uint local_44;
  char *local_40;
  char *local_38;
  
  local_9a0 = (undefined1  [8])&material.name._M_string_length;
  material.name._M_dataplus._M_p = (pointer)0x0;
  material.name._M_string_length._0_1_ = 0;
  material._104_8_ = &material.ambient_texname._M_string_length;
  material.ambient_texname._M_dataplus._M_p = (pointer)0x0;
  material.ambient_texname._M_string_length._0_1_ = 0;
  material.ambient_texname.field_2._8_8_ = &material.diffuse_texname._M_string_length;
  material.diffuse_texname._M_dataplus._M_p = (pointer)0x0;
  material.diffuse_texname._M_string_length._0_1_ = 0;
  material.diffuse_texname.field_2._8_8_ = &material.specular_texname._M_string_length;
  material.specular_texname._M_dataplus._M_p = (pointer)0x0;
  material.specular_texname._M_string_length._0_1_ = 0;
  material.specular_texname.field_2._8_8_ = &material.specular_highlight_texname._M_string_length;
  material.specular_highlight_texname._M_dataplus._M_p = (pointer)0x0;
  material.specular_highlight_texname._M_string_length._0_1_ = 0;
  material.specular_highlight_texname.field_2._8_8_ = &material.bump_texname._M_string_length;
  material.bump_texname._M_dataplus._M_p = (pointer)0x0;
  material.bump_texname._M_string_length._0_1_ = 0;
  material.bump_texname.field_2._8_8_ = &material.displacement_texname._M_string_length;
  material.displacement_texname._M_dataplus._M_p = (pointer)0x0;
  material.displacement_texname._M_string_length._0_1_ = 0;
  material.displacement_texname.field_2._8_8_ = &material.alpha_texname._M_string_length;
  material.alpha_texname._M_dataplus._M_p = (pointer)0x0;
  material.alpha_texname._M_string_length._0_1_ = 0;
  material.alpha_texname.field_2._8_8_ = &material.reflection_texname._M_string_length;
  material.reflection_texname._M_dataplus._M_p = (pointer)0x0;
  material.reflection_texname._M_string_length._0_1_ = 0;
  material.ambient_texopt._56_8_ = &material.ambient_texopt.colorspace._M_string_length;
  material.ambient_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.ambient_texopt.colorspace._M_string_length._0_1_ = 0;
  material.diffuse_texopt._56_8_ = &material.diffuse_texopt.colorspace._M_string_length;
  material.diffuse_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.diffuse_texopt.colorspace._M_string_length._0_1_ = 0;
  material.specular_texopt._56_8_ = &material.specular_texopt.colorspace._M_string_length;
  material.specular_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.specular_texopt.colorspace._M_string_length._0_1_ = 0;
  material.specular_highlight_texopt._56_8_ =
       &material.specular_highlight_texopt.colorspace._M_string_length;
  material.specular_highlight_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.specular_highlight_texopt.colorspace._M_string_length._0_1_ = 0;
  material.bump_texopt._56_8_ = &material.bump_texopt.colorspace._M_string_length;
  material.bump_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.bump_texopt.colorspace._M_string_length._0_1_ = 0;
  material.displacement_texopt._56_8_ = &material.displacement_texopt.colorspace._M_string_length;
  material.displacement_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.displacement_texopt.colorspace._M_string_length._0_1_ = 0;
  material.alpha_texopt._56_8_ = &material.alpha_texopt.colorspace._M_string_length;
  material.alpha_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.alpha_texopt.colorspace._M_string_length._0_1_ = 0;
  material.reflection_texopt._56_8_ = &material.reflection_texopt.colorspace._M_string_length;
  material.reflection_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.reflection_texopt.colorspace._M_string_length._0_1_ = 0;
  material._1160_8_ = &material.roughness_texname._M_string_length;
  material.roughness_texname._M_dataplus._M_p = (pointer)0x0;
  material.roughness_texname._M_string_length._0_1_ = 0;
  material.roughness_texname.field_2._8_8_ = &material.metallic_texname._M_string_length;
  material.metallic_texname._M_dataplus._M_p = (pointer)0x0;
  material.metallic_texname._M_string_length._0_1_ = 0;
  material.metallic_texname.field_2._8_8_ = &material.sheen_texname._M_string_length;
  material.sheen_texname._M_dataplus._M_p = (pointer)0x0;
  material.sheen_texname._M_string_length._0_1_ = 0;
  material.sheen_texname.field_2._8_8_ = &material.emissive_texname._M_string_length;
  material.emissive_texname._M_dataplus._M_p = (pointer)0x0;
  material.emissive_texname._M_string_length._0_1_ = 0;
  material.emissive_texname.field_2._8_8_ = &material.normal_texname._M_string_length;
  material.normal_texname._M_dataplus._M_p = (pointer)0x0;
  material.normal_texname._M_string_length._0_1_ = 0;
  material.roughness_texopt._56_8_ = &material.roughness_texopt.colorspace._M_string_length;
  material.roughness_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.roughness_texopt.colorspace._M_string_length._0_1_ = 0;
  material.metallic_texopt._56_8_ = &material.metallic_texopt.colorspace._M_string_length;
  material.metallic_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.metallic_texopt.colorspace._M_string_length._0_1_ = 0;
  material.sheen_texopt._56_8_ = &material.sheen_texopt.colorspace._M_string_length;
  material.sheen_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.sheen_texopt.colorspace._M_string_length._0_1_ = 0;
  material.emissive_texopt._56_8_ = &material.emissive_texopt.colorspace._M_string_length;
  material.emissive_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.emissive_texopt.colorspace._M_string_length._0_1_ = 0;
  material.normal_texopt._56_8_ = &material.normal_texopt.colorspace._M_string_length;
  material.normal_texopt.colorspace._M_dataplus._M_p = (pointer)0x0;
  material.normal_texopt.colorspace._M_string_length._0_1_ = 0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&material.unknown_parameter;
  material.unknown_parameter._M_t._M_impl._0_4_ = 0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  linebuf.field_2._8_8_ = warning;
  local_58 = materials;
  InitMaterial((material_t *)local_9a0);
  std::__cxx11::stringstream::stringstream(local_b28);
  local_d0 = (undefined1  [8])&linebuf._M_string_length;
  linebuf._M_dataplus._M_p = (pointer)0x0;
  linebuf._M_string_length._0_1_ = 0;
  local_48 = 0;
LAB_00111341:
  local_50 = (pointer)((ulong)local_50 & 0xffffffff00000000);
LAB_00111348:
  local_44 = 0;
LAB_0011134f:
  do {
    do {
      do {
        iVar7 = std::istream::peek();
        if (iVar7 == -1) {
          pmVar4 = (local_58->
                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pmVar5 = (local_58->
                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::string
                    ((string *)
                     &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_9a0);
          local_238 = (undefined4)(((long)pmVar5 - (long)pmVar4) / 0x748);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)material_map,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)&material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
                    );
          std::__cxx11::string::~string
                    ((string *)
                     &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                    (local_58,(value_type *)local_9a0);
          if (linebuf.field_2._8_8_ != 0) {
            std::__cxx11::stringbuf::str();
            psVar1 = &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count;
            std::__cxx11::string::operator=((string *)linebuf.field_2._8_8_,(string *)psVar1);
            std::__cxx11::string::~string((string *)psVar1);
          }
          std::__cxx11::string::~string((string *)local_d0);
          std::__cxx11::stringstream::~stringstream(local_b28);
          material_t::~material_t((material_t *)local_9a0);
          return;
        }
        safeGetline(inStream,(string *)local_d0);
      } while (linebuf._M_dataplus._M_p == (pointer)0x0);
      lVar8 = std::__cxx11::string::find_last_not_of((char *)local_d0,0x13b670);
      lVar8 = lVar8 + 1;
      psVar1 = &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::substr((ulong)psVar1,(ulong)local_d0);
      std::__cxx11::string::operator=((string *)local_d0,(string *)psVar1);
      std::__cxx11::string::~string((string *)psVar1);
    } while (((linebuf._M_dataplus._M_p == (pointer)0x0) ||
             ((((pointer)((long)local_d0 + -1))[(long)linebuf._M_dataplus._M_p] == '\n' &&
              (std::__cxx11::string::erase((ulong)local_d0,(ulong)(linebuf._M_dataplus._M_p + -1)),
              linebuf._M_dataplus._M_p == (pointer)0x0)))) ||
            ((((pointer)((long)local_d0 + -1))[(long)linebuf._M_dataplus._M_p] == '\r' &&
             (std::__cxx11::string::erase((ulong)local_d0,(ulong)(linebuf._M_dataplus._M_p + -1)),
             linebuf._M_dataplus._M_p == (pointer)0x0))));
    auVar6 = local_d0;
    sVar9 = strspn((char *)local_d0," \t");
    local_38 = (char *)((long)auVar6 + sVar9);
    if (auVar6 == (undefined1  [8])0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/objl/tiny_obj_loader.h"
                    ,0x6b3,
                    "void tinyobj::LoadMtl(std::map<std::string, int> *, std::vector<material_t> *, std::istream *, std::string *, std::string *)"
                   );
    }
    cVar2 = *local_38;
  } while ((cVar2 == '\0') || (cVar2 == '#'));
  local_40 = local_38;
  iVar7 = strncmp(local_38,"newmtl",6);
  if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
    if (material.name._M_dataplus._M_p != (pointer)0x0) {
      local_50 = (local_58->
                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pmVar4 = (local_58->
               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::string
                ((string *)
                 &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)local_9a0);
      local_238 = (undefined4)(((long)pmVar4 - (long)local_50) / 0x748);
      psVar1 = &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                  *)material_map,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)psVar1);
      std::__cxx11::string::~string((string *)psVar1);
      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                (local_58,(value_type *)local_9a0);
    }
    InitMaterial((material_t *)local_9a0);
    local_40 = local_40 + 7;
    local_38 = local_40;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator<<(local_248,local_40);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_9a0,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count);
    goto LAB_00111341;
  }
  if (cVar2 != 'T') {
    if (cVar2 != 'N') {
      if (cVar2 == 'K') {
        cVar3 = local_40[1];
        if (cVar3 == 't') {
          if ((local_40[2] == '\t') || (local_40[2] == ' ')) goto LAB_00111761;
        }
        else if (cVar3 == 'd') {
          if ((local_40[2] == ' ') || (local_40[2] == '\t')) {
            local_38 = local_40 + 2;
            parseReal3((real_t *)
                       &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (real_t *)local_78,(real_t *)local_a0,&local_38,0.0,0.0,0.0);
            material.ambient[2] = (real_t)local_78._0_4_;
            material.ambient[1] =
                 (real_t)material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count
            ;
            material.diffuse[0] = (real_t)local_a0._0_4_;
            local_48 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            goto LAB_0011134f;
          }
        }
        else if (cVar3 == 'e') {
          if ((local_40[2] == ' ') || (local_40[2] == '\t')) {
            local_38 = local_40 + 2;
            parseReal3((real_t *)
                       &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (real_t *)local_78,(real_t *)local_a0,&local_38,0.0,0.0,0.0);
            material.transmittance[2] = (real_t)local_78._0_4_;
            goto LAB_0011134f;
          }
        }
        else if (cVar3 == 's') {
          if ((local_40[2] == ' ') || (local_40[2] == '\t')) {
            local_38 = local_40 + 2;
            parseReal3((real_t *)
                       &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (real_t *)local_78,(real_t *)local_a0,&local_38,0.0,0.0,0.0);
            material.diffuse[2] = (real_t)local_78._0_4_;
            goto LAB_0011134f;
          }
        }
        else if ((cVar3 == 'a') && ((local_40[2] == ' ' || (local_40[2] == '\t')))) {
          local_38 = local_40 + 2;
          parseReal3((real_t *)
                     &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (real_t *)local_78,(real_t *)local_a0,&local_38,0.0,0.0,0.0);
          material.name.field_2._12_4_ = local_78._0_4_;
          goto LAB_0011134f;
        }
      }
LAB_001117bf:
      uVar12 = 0;
      goto LAB_001117c1;
    }
    if (local_40[1] == 's') {
      if ((local_40[2] != ' ') && (local_40[2] != '\t')) goto LAB_001117bf;
      local_38 = local_40 + 2;
      material.emission[1] = parseReal(&local_38,0.0);
    }
    else {
      if ((local_40[1] != 'i') || ((local_40[2] != ' ' && (local_40[2] != '\t'))))
      goto LAB_001117bf;
      local_38 = local_40 + 2;
      material.emission[2] = parseReal(&local_38,0.0);
    }
    goto LAB_0011134f;
  }
  uVar12 = CONCAT71((int7)((ulong)lVar8 >> 8),1);
  if ((local_40[1] == 'f') && ((local_40[2] == ' ' || (local_40[2] == '\t')))) {
LAB_00111761:
    local_38 = local_40 + 2;
    parseReal3((real_t *)
               &material.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (real_t *)local_78,(real_t *)local_a0,&local_38,0.0,0.0,0.0);
    material.specular[2] = (real_t)local_78._0_4_;
    goto LAB_0011134f;
  }
LAB_001117c1:
  local_7c = (undefined4)uVar12;
  iVar7 = strncmp(local_40,"illum",5);
  if ((iVar7 == 0) && ((local_40[5] == ' ' || (local_40[5] == '\t')))) {
    local_38 = local_40 + 6;
    material.ior = (real_t)parseInt(&local_38);
    goto LAB_0011134f;
  }
  if ((cVar2 == 'd') && ((local_40[1] == ' ' || (local_40[1] == '\t')))) {
    local_38 = local_40 + 1;
    material.shininess = parseReal(&local_38,0.0);
    if (((ulong)local_50 & 1) == 0) {
      local_44 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      local_50 = (pointer)((ulong)local_50 & 0xffffffff00000000);
      goto LAB_0011134f;
    }
  }
  else {
    if ((((char)local_7c == '\0') || (local_40[1] != 'r')) ||
       ((local_40[2] != ' ' && (local_40[2] != '\t')))) {
      if (cVar2 == 'P') {
        cVar2 = local_40[1];
        if (cVar2 == 'c') {
          if ((local_40[2] == ' ') || (local_40[2] == '\t')) {
            local_38 = local_40 + 2;
            material.metallic = parseReal(&local_38,0.0);
            goto LAB_0011134f;
          }
        }
        else if (cVar2 == 'm') {
          if ((local_40[2] == ' ') || (local_40[2] == '\t')) {
            local_38 = local_40 + 2;
            material.reflection_texopt.colorspace.field_2._12_4_ = parseReal(&local_38,0.0);
            goto LAB_0011134f;
          }
        }
        else if (cVar2 == 's') {
          if ((local_40[2] == ' ') || (local_40[2] == '\t')) {
            local_38 = local_40 + 2;
            material.roughness = parseReal(&local_38,0.0);
            goto LAB_0011134f;
          }
        }
        else if ((cVar2 == 'r') && ((local_40[2] == ' ' || (local_40[2] == '\t')))) {
          local_38 = local_40 + 2;
          material.reflection_texopt.colorspace.field_2._8_4_ = parseReal(&local_38,0.0);
          goto LAB_0011134f;
        }
        if (((local_40[1] == 'c') && (local_40[2] == 'r')) &&
           ((local_40[3] == ' ' || (local_40[3] == '\t')))) {
          local_38 = local_40 + 4;
          material.sheen = parseReal(&local_38,0.0);
          goto LAB_0011134f;
        }
      }
      iVar7 = strncmp(local_40,"aniso",5);
      if ((iVar7 == 0) && ((local_40[5] == ' ' || (local_40[5] == '\t')))) {
        local_38 = local_40 + 6;
        material.clearcoat_thickness = parseReal(&local_38,0.0);
        goto LAB_0011134f;
      }
      iVar7 = strncmp(local_40,"anisor",6);
      if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
        local_38 = local_40 + 7;
        material.clearcoat_roughness = parseReal(&local_38,0.0);
        goto LAB_0011134f;
      }
      iVar7 = strncmp(local_40,"map_Ka",6);
      if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
        local_40 = local_40 + 7;
        texname = (string *)&material.illum;
        texopt = (texture_option_t *)((long)&material.reflection_texname.field_2 + 8);
        local_38 = local_40;
      }
      else {
        iVar7 = strncmp(local_40,"map_Kd",6);
        if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
          local_38 = local_40 + 7;
          ParseTextureNameAndOption
                    ((string *)((long)&material.ambient_texname.field_2 + 8),
                     (texture_option_t *)((long)&material.ambient_texopt.colorspace.field_2 + 8),
                     local_38);
          if ((local_48 & 1) == 0) {
            material.ambient[1] = 0.6;
            material.ambient[2] = 0.6;
            material.diffuse[0] = 0.6;
            local_48 = 0;
          }
          else {
            local_48 = (uint)CONCAT71(extraout_var,1);
          }
          goto LAB_0011134f;
        }
        iVar7 = strncmp(local_40,"map_Ks",6);
        if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
          local_40 = local_40 + 7;
          texname = (string *)((long)&material.diffuse_texname.field_2 + 8);
          texopt = (texture_option_t *)((long)&material.diffuse_texopt.colorspace.field_2 + 8);
          local_38 = local_40;
        }
        else {
          iVar7 = strncmp(local_40,"map_Ns",6);
          if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
            local_40 = local_40 + 7;
            texname = (string *)((long)&material.specular_texname.field_2 + 8);
            texopt = (texture_option_t *)((long)&material.specular_texopt.colorspace.field_2 + 8);
            local_38 = local_40;
          }
          else {
            iVar7 = strncmp(local_40,"map_bump",8);
            if (((iVar7 == 0) && ((local_40[8] == ' ' || (local_40[8] == '\t')))) ||
               ((iVar7 = strncmp(local_40,"map_Bump",8), iVar7 == 0 &&
                ((local_40[8] == ' ' || (local_40[8] == '\t')))))) {
              local_40 = local_40 + 9;
            }
            else {
              iVar7 = strncmp(local_40,"bump",4);
              if ((iVar7 != 0) || ((local_40[4] != ' ' && (local_40[4] != '\t')))) {
                iVar7 = strncmp(local_40,"map_d",5);
                if ((iVar7 == 0) && ((local_40[5] == ' ' || (local_40[5] == '\t')))) {
                  local_40 = local_40 + 6;
                  texname = (string *)(material.displacement_texname.field_2._M_local_buf + 8);
                  local_38 = local_40;
                  std::__cxx11::string::assign((char *)texname);
                  texopt = (texture_option_t *)
                           ((long)&material.displacement_texopt.colorspace.field_2 + 8);
                  goto LAB_00111e3d;
                }
                iVar7 = strncmp(local_40,"disp",4);
                if ((iVar7 == 0) && ((local_40[4] == ' ' || (local_40[4] == '\t')))) {
                  local_40 = local_40 + 5;
                  texname = (string *)((long)&material.bump_texname.field_2 + 8);
                  texopt = (texture_option_t *)((long)&material.bump_texopt.colorspace.field_2 + 8);
                  local_38 = local_40;
                }
                else {
                  iVar7 = strncmp(local_40,"refl",4);
                  if ((iVar7 == 0) && ((local_40[4] == ' ' || (local_40[4] == '\t')))) {
                    local_40 = local_40 + 5;
                    texname = (string *)((long)&material.alpha_texname.field_2 + 8);
                    texopt = (texture_option_t *)
                             ((long)&material.alpha_texopt.colorspace.field_2 + 8);
                    local_38 = local_40;
                  }
                  else {
                    iVar7 = strncmp(local_40,"map_Pr",6);
                    if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
                      local_40 = local_40 + 7;
                      texname = (string *)&material.anisotropy_rotation;
                      texopt = (texture_option_t *)((long)&material.normal_texname.field_2 + 8);
                      local_38 = local_40;
                    }
                    else {
                      iVar7 = strncmp(local_40,"map_Pm",6);
                      if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
                        local_40 = local_40 + 7;
                        texname = (string *)((long)&material.roughness_texname.field_2 + 8);
                        texopt = (texture_option_t *)
                                 ((long)&material.roughness_texopt.colorspace.field_2 + 8);
                        local_38 = local_40;
                      }
                      else {
                        iVar7 = strncmp(local_40,"map_Ps",6);
                        if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
                          local_40 = local_40 + 7;
                          texname = (string *)((long)&material.metallic_texname.field_2 + 8);
                          texopt = (texture_option_t *)
                                   ((long)&material.metallic_texopt.colorspace.field_2 + 8);
                          local_38 = local_40;
                        }
                        else {
                          iVar7 = strncmp(local_40,"map_Ke",6);
                          if ((iVar7 == 0) && ((local_40[6] == ' ' || (local_40[6] == '\t')))) {
                            local_40 = local_40 + 7;
                            texname = (string *)((long)&material.sheen_texname.field_2 + 8);
                            texopt = (texture_option_t *)
                                     ((long)&material.sheen_texopt.colorspace.field_2 + 8);
                            local_38 = local_40;
                          }
                          else {
                            iVar7 = strncmp(local_40,"norm",4);
                            if ((iVar7 != 0) || ((local_40[4] != ' ' && (local_40[4] != '\t')))) {
                              pcVar11 = strchr(local_40,0x20);
                              if ((pcVar11 != (char *)0x0) ||
                                 (pcVar11 = strchr(local_40,9), pcVar11 != (char *)0x0)) {
                                local_78 = (undefined1  [8])local_68;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_78,local_40,pcVar11);
                                psVar1 = &material.unknown_parameter._M_t._M_impl.
                                          super__Rb_tree_header._M_node_count;
                                std::__cxx11::string::string
                                          ((string *)local_a0,pcVar11 + 1,(allocator *)psVar1);
                                std::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)psVar1,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_78,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_a0);
                                std::
                                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                ::
                                _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                            *)&material.pad2,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)psVar1);
                                std::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)psVar1);
                                std::__cxx11::string::~string((string *)local_a0);
                                std::__cxx11::string::~string((string *)local_78);
                              }
                              goto LAB_0011134f;
                            }
                            local_40 = local_40 + 5;
                            texname = (string *)((long)&material.emissive_texname.field_2 + 8);
                            texopt = (texture_option_t *)
                                     ((long)&material.emissive_texopt.colorspace.field_2 + 8);
                            local_38 = local_40;
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00111e3d;
              }
              local_40 = local_40 + 5;
            }
            texname = (string *)((long)&material.specular_highlight_texname.field_2 + 8);
            texopt = (texture_option_t *)
                     ((long)&material.specular_highlight_texopt.colorspace.field_2 + 8);
            local_38 = local_40;
          }
        }
      }
LAB_00111e3d:
      ParseTextureNameAndOption(texname,texopt,local_40);
      goto LAB_0011134f;
    }
    local_38 = local_40 + 2;
    if ((local_44 & 1) == 0) goto LAB_00111fde;
  }
  poVar10 = std::operator<<(local_b18,"Both `d` and `Tr` parameters defined for \"");
  poVar10 = std::operator<<(poVar10,(string *)local_9a0);
  poVar10 = std::operator<<(poVar10,"\". Use the value of `d` for dissolve (line ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10," in .mtl.)");
  local_50 = (pointer)CONCAT44(local_50._4_4_,(int)CONCAT71((int7)((ulong)uVar12 >> 8),1));
  poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
  local_44 = (uint)CONCAT71((int7)((ulong)poVar10 >> 8),1);
  goto LAB_0011134f;
LAB_00111fde:
  rVar13 = parseReal(&local_38,0.0);
  material.shininess = 1.0 - rVar13;
  local_50 = (pointer)CONCAT44(local_50._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1));
  goto LAB_00111348;
}

Assistant:

void LoadMtl(std::map<std::string, int> *material_map,
             std::vector<material_t> *materials, std::istream *inStream,
             std::string *warning, std::string *err) {
  (void)err;

  // Create a default material anyway.
  material_t material;
  InitMaterial(&material);

  // Issue 43. `d` wins against `Tr` since `Tr` is not in the MTL specification.
  bool has_d = false;
  bool has_tr = false;

  // has_kd is used to set a default diffuse value when map_Kd is present
  // and Kd is not.
  bool has_kd = false;

  std::stringstream warn_ss;

  size_t line_no = 0;
  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);
    line_no++;

    // Trim trailing whitespace.
    if (linebuf.size() > 0) {
      linebuf = linebuf.substr(0, linebuf.find_last_not_of(" \t") + 1);
    }

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // new mtl
    if ((0 == strncmp(token, "newmtl", 6)) && IS_SPACE((token[6]))) {
      // flush previous material.
      if (!material.name.empty()) {
        material_map->insert(std::pair<std::string, int>(
            material.name, static_cast<int>(materials->size())));
        materials->push_back(material);
      }

      // initial temporary material
      InitMaterial(&material);

      has_d = false;
      has_tr = false;

      // set new mtl name
      token += 7;
      {
        std::stringstream sstr;
        sstr << token;
        material.name = sstr.str();
      }
      continue;
    }

    // ambient
    if (token[0] == 'K' && token[1] == 'a' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.ambient[0] = r;
      material.ambient[1] = g;
      material.ambient[2] = b;
      continue;
    }

    // diffuse
    if (token[0] == 'K' && token[1] == 'd' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.diffuse[0] = r;
      material.diffuse[1] = g;
      material.diffuse[2] = b;
      has_kd = true;
      continue;
    }

    // specular
    if (token[0] == 'K' && token[1] == 's' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.specular[0] = r;
      material.specular[1] = g;
      material.specular[2] = b;
      continue;
    }

    // transmittance
    if ((token[0] == 'K' && token[1] == 't' && IS_SPACE((token[2]))) ||
        (token[0] == 'T' && token[1] == 'f' && IS_SPACE((token[2])))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.transmittance[0] = r;
      material.transmittance[1] = g;
      material.transmittance[2] = b;
      continue;
    }

    // ior(index of refraction)
    if (token[0] == 'N' && token[1] == 'i' && IS_SPACE((token[2]))) {
      token += 2;
      material.ior = parseReal(&token);
      continue;
    }

    // emission
    if (token[0] == 'K' && token[1] == 'e' && IS_SPACE(token[2])) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.emission[0] = r;
      material.emission[1] = g;
      material.emission[2] = b;
      continue;
    }

    // shininess
    if (token[0] == 'N' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.shininess = parseReal(&token);
      continue;
    }

    // illum model
    if (0 == strncmp(token, "illum", 5) && IS_SPACE(token[5])) {
      token += 6;
      material.illum = parseInt(&token);
      continue;
    }

    // dissolve
    if ((token[0] == 'd' && IS_SPACE(token[1]))) {
      token += 1;
      material.dissolve = parseReal(&token);

      if (has_tr) {
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      }
      has_d = true;
      continue;
    }
    if (token[0] == 'T' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      if (has_d) {
        // `d` wins. Ignore `Tr` value.
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      } else {
        // We invert value of Tr(assume Tr is in range [0, 1])
        // NOTE: Interpretation of Tr is application(exporter) dependent. For
        // some application(e.g. 3ds max obj exporter), Tr = d(Issue 43)
        material.dissolve = static_cast<real_t>(1.0) - parseReal(&token);
      }
      has_tr = true;
      continue;
    }

    // PBR: roughness
    if (token[0] == 'P' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      material.roughness = parseReal(&token);
      continue;
    }

    // PBR: metallic
    if (token[0] == 'P' && token[1] == 'm' && IS_SPACE(token[2])) {
      token += 2;
      material.metallic = parseReal(&token);
      continue;
    }

    // PBR: sheen
    if (token[0] == 'P' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.sheen = parseReal(&token);
      continue;
    }

    // PBR: clearcoat thickness
    if (token[0] == 'P' && token[1] == 'c' && IS_SPACE(token[2])) {
      token += 2;
      material.clearcoat_thickness = parseReal(&token);
      continue;
    }

    // PBR: clearcoat roughness
    if ((0 == strncmp(token, "Pcr", 3)) && IS_SPACE(token[3])) {
      token += 4;
      material.clearcoat_roughness = parseReal(&token);
      continue;
    }

    // PBR: anisotropy
    if ((0 == strncmp(token, "aniso", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.anisotropy = parseReal(&token);
      continue;
    }

    // PBR: anisotropy rotation
    if ((0 == strncmp(token, "anisor", 6)) && IS_SPACE(token[6])) {
      token += 7;
      material.anisotropy_rotation = parseReal(&token);
      continue;
    }

    // ambient texture
    if ((0 == strncmp(token, "map_Ka", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.ambient_texname),
                                &(material.ambient_texopt), token);
      continue;
    }

    // diffuse texture
    if ((0 == strncmp(token, "map_Kd", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.diffuse_texname),
                                &(material.diffuse_texopt), token);

      // Set a decent diffuse default value if a diffuse texture is specified
      // without a matching Kd value.
      if (!has_kd)
      {
        material.diffuse[0] = static_cast<real_t>(0.6);
        material.diffuse[1] = static_cast<real_t>(0.6);
        material.diffuse[2] = static_cast<real_t>(0.6);
      }

      continue;
    }

    // specular texture
    if ((0 == strncmp(token, "map_Ks", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_texname),
                                &(material.specular_texopt), token);
      continue;
    }

    // specular highlight texture
    if ((0 == strncmp(token, "map_Ns", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_highlight_texname),
                                &(material.specular_highlight_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_Bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "bump", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // alpha texture
    if ((0 == strncmp(token, "map_d", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.alpha_texname = token;
      ParseTextureNameAndOption(&(material.alpha_texname),
                                &(material.alpha_texopt), token);
      continue;
    }

    // displacement texture
    if ((0 == strncmp(token, "disp", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.displacement_texname),
                                &(material.displacement_texopt), token);
      continue;
    }

    // reflection map
    if ((0 == strncmp(token, "refl", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.reflection_texname),
                                &(material.reflection_texopt), token);
      continue;
    }

    // PBR: roughness texture
    if ((0 == strncmp(token, "map_Pr", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.roughness_texname),
                                &(material.roughness_texopt), token);
      continue;
    }

    // PBR: metallic texture
    if ((0 == strncmp(token, "map_Pm", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.metallic_texname),
                                &(material.metallic_texopt), token);
      continue;
    }

    // PBR: sheen texture
    if ((0 == strncmp(token, "map_Ps", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.sheen_texname),
                                &(material.sheen_texopt), token);
      continue;
    }

    // PBR: emissive texture
    if ((0 == strncmp(token, "map_Ke", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.emissive_texname),
                                &(material.emissive_texopt), token);
      continue;
    }

    // PBR: normal map texture
    if ((0 == strncmp(token, "norm", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.normal_texname),
                                &(material.normal_texopt), token);
      continue;
    }

    // unknown parameter
    const char *_space = strchr(token, ' ');
    if (!_space) {
      _space = strchr(token, '\t');
    }
    if (_space) {
      std::ptrdiff_t len = _space - token;
      std::string key(token, static_cast<size_t>(len));
      std::string value = _space + 1;
      material.unknown_parameter.insert(
          std::pair<std::string, std::string>(key, value));
    }
  }
  // flush last material.
  material_map->insert(std::pair<std::string, int>(
      material.name, static_cast<int>(materials->size())));
  materials->push_back(material);

  if (warning) {
    (*warning) = warn_ss.str();
  }
}